

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-cat.c
# Opt level: O1

int main(int argc,char **argv)

{
  size_t __ptr;
  int iVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  ulong start_00;
  char str [300];
  undefined1 local_410 [8];
  BigArrayIter iter;
  BigArray array;
  BigBlock bb;
  ulong local_60;
  size_t buffersize;
  BigFile local_50;
  BigFile bf;
  ulong local_40;
  ptrdiff_t start;
  ptrdiff_t size;
  
  local_50.basename = (char *)0x0;
  array.data = (void *)0x0;
  local_40 = 0;
  start = -1;
  local_60 = 0x10000000;
  bf.basename._4_4_ = 1;
  buffersize = 0;
  do {
    while( true ) {
      while (iVar1 = getopt(argc,argv,"bo:c:B:f:"), 0x62 < iVar1) {
        if (iVar1 == 99) {
          puVar5 = (ulong *)&start;
          goto LAB_001025c7;
        }
        if (iVar1 == 0x6f) {
          puVar5 = &local_40;
          goto LAB_001025c7;
        }
        if (iVar1 != 0x66) goto LAB_00102856;
        buffersize = _optarg;
      }
      if (iVar1 != 0x42) break;
      puVar5 = &local_60;
LAB_001025c7:
      __isoc99_sscanf(_optarg,"%td",puVar5);
    }
    if (iVar1 == -1) {
      if (argc - _optind == 2) {
        lVar2 = (long)_optind;
        iVar1 = big_file_open(&local_50,argv[lVar2]);
        if (iVar1 != 0) goto LAB_00102860;
        iVar1 = big_file_open_block(&local_50,(BigBlock *)&array.data,(argv + lVar2)[1]);
        if (iVar1 != 0) goto LAB_00102868;
        if ((start == -1) || (start + local_40 != 0)) {
          start = -local_40;
        }
        count = start;
        signal(10,usr1);
        uVar3 = local_60;
        lVar2 = start + local_40;
        big_file_dtype_itemsize((char *)&array.data);
        if (lVar2 <= (long)local_40) goto LAB_0010282d;
        uVar3 = uVar3 / 0;
        start_00 = local_40;
        while( true ) {
          uVar4 = start;
          if (uVar3 < (ulong)start) {
            uVar4 = uVar3;
          }
          uVar3 = uVar4;
          iVar1 = big_block_read_simple
                            ((BigBlock *)&array.data,start_00,uVar3,(BigArray *)&iter.dataptr,
                             (char *)0x0);
          __ptr = array.size;
          if (iVar1 != 0) break;
          if (bf.basename._4_4_ == 0) {
            iVar1 = big_file_dtype_itemsize((char *)&array.data);
            fwrite((void *)__ptr,(long)iVar1,array.strides[0x1f],_stdout);
          }
          else {
            big_array_iter_init((BigArrayIter *)local_410,(BigArray *)&iter.dataptr);
            if (array._8_8_ != 0) {
              uVar4 = 0;
              do {
                fputc(10,_stdout);
                uVar4 = uVar4 + 1;
              } while (uVar4 < (ulong)array._8_8_);
            }
          }
          free((void *)array.size);
          start_00 = start_00 + array._8_8_;
          countin = countin + array._8_8_;
          if (lVar2 <= (long)start_00) {
LAB_0010282d:
            big_block_close((BigBlock *)&array.data);
            big_file_close(&local_50);
            return 0;
          }
        }
      }
      else {
LAB_00102856:
        usage();
      }
      main_cold_3();
LAB_00102860:
      main_cold_1();
LAB_00102868:
      main_cold_2();
      fwrite("usage: bigfile-cat [-b] [-o offset] [-c count] [-B buffersize] filepath block \n",0x4f
             ,1,_stderr);
      fwrite("-b direct binary dump \n",0x17,1,_stderr);
      fwrite("-o seek to item at offset \n",0x1b,1,_stderr);
      fwrite("-c read item count \n",0x14,1,_stderr);
      fwrite("-B blocksize in bytes used in IO \n",0x22,1,_stderr);
      exit(1);
    }
    if (iVar1 != 0x62) goto LAB_00102856;
    bf.basename._4_4_ = 0;
  } while( true );
}

Assistant:

int main(int argc, char * argv[]) {
    BigFile bf = {0};
    BigBlock bb = {0};
    int opt;

    int humane = 1; /* binary or ascii */
    ptrdiff_t start = 0;
    ptrdiff_t size = -1;

    size_t buffersize = 256 * 1024 * 1024;

    char * fmt = NULL;

    while(-1 != (opt = getopt(argc, argv, "bo:c:B:f:"))) {
        switch(opt) {
            case 'f':
                fmt = optarg;
                break;
            case 'b':
                humane = 0;
                break;
            case 'o':
                sscanf(optarg, "%td", &start);
                break;
            case 'c':
                sscanf(optarg, "%td", &size);
                break;
            case 'B':
                sscanf(optarg, "%td", &buffersize);
                break;
            default:
                usage();
        }
    }
    if(argc - optind != 2) {
        usage();
    }
    argv += optind - 1;
    if(0 != big_file_open(&bf, argv[1])) {
        fprintf(stderr, "failed to open: %s: %s\n", argv[1], big_file_get_error_message());
        exit(1);
    }
    if(0 != big_file_open_block(&bf, &bb, argv[2])) {
        fprintf(stderr, "failed to open: %s: %s\n", argv[2], big_file_get_error_message());
        exit(1);
    }
    if(size == -1 || bb.size < size + start) {
        size = bb.size - start;
    } 

    count = size;

    signal(SIGUSR1, usr1);

    ptrdiff_t end = start + size;

    size_t chunksize = buffersize / (bb.nmemb * big_file_dtype_itemsize(bb.dtype));
    BigBlockPtr ptr;
    BigBlockPtr ptrnew;
    ptrdiff_t offset;
    BigArray array;

    for(offset = start; offset < end; ) {
        if(chunksize > size) chunksize = size;
        if(0 != big_block_read_simple(&bb, offset, chunksize, &array, NULL)) {
            fprintf(stderr, "failed to read original: %s\n", big_file_get_error_message());
            exit(1);
        }

        if(!humane) {
            fwrite(array.data, big_file_dtype_itemsize(bb.dtype), array.size, stdout);
        } else {
            char str[300];
            BigArrayIter iter;
            big_array_iter_init(&iter, &array);
            size_t i;
            for(i = 0; i < array.dims[0]; i++) {
                int j;
                for(j = 0; j < bb.nmemb; j ++) {
                    big_file_dtype_format(str, array.dtype, iter.dataptr, fmt);
                    big_array_iter_advance(&iter);
                    fprintf(stdout, "%s ", str);
                }
                fprintf(stdout, "\n");
            }
        }
        free(array.data);
        offset += array.dims[0];
        countin += array.dims[0];
    }
    big_block_close(&bb);
    big_file_close(&bf);
    return 0;
}